

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void __thiscall QDir::setNameFilters(QDir *this,QStringList *nameFilters)

{
  QDirPrivate *this_00;
  
  this_00 = QSharedDataPointer<QDirPrivate>::data(&this->d_ptr);
  QDirPrivate::clearCache(this_00,KeepMetaData);
  QArrayDataPointer<QString>::operator=(&(this_00->nameFilters).d,&nameFilters->d);
  return;
}

Assistant:

void QDir::setNameFilters(const QStringList &nameFilters)
{
    Q_D(QDir);
    d->clearCache(QDirPrivate::KeepMetaData);
    d->nameFilters = nameFilters;
}